

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
* __thiscall
phmap::priv::
node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
::operator=(node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
            *this,node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                  *other)

{
  bool bVar1;
  allocator<std::unique_ptr<int,_std::default_delete<int>_>_> *__args;
  allocator_type *alloc;
  slot_type *new_slot;
  slot_type *old_slot;
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  *other_local;
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  *this_local;
  
  destroy(this);
  bVar1 = empty(other);
  if (!bVar1) {
    bVar1 = std::optional::operator_cast_to_bool((optional *)other);
    if (bVar1) {
      __args = std::optional<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>::
               value(&other->alloc_);
      std::optional<std::allocator<std::unique_ptr<int,std::default_delete<int>>>>::
      emplace<std::allocator<std::unique_ptr<int,std::default_delete<int>>>&>
                ((optional<std::allocator<std::unique_ptr<int,std::default_delete<int>>>> *)this,
                 __args);
    }
    alloc = node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
            ::alloc(this);
    new_slot = slot(this);
    old_slot = slot(other);
    hash_policy_traits<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>,void>
    ::transfer<std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
              (alloc,new_slot,old_slot);
    reset(other);
  }
  return this;
}

Assistant:

node_handle_base& operator=(node_handle_base&& other) noexcept {
        destroy();
        if (!other.empty()) {
            if (other.alloc_) {
               alloc_.emplace(other.alloc_.value());
            }
            PolicyTraits::transfer(alloc(), slot(), other.slot());
            other.reset();
        }
        return *this;
    }